

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O1

bool __thiscall FDiskFile::Open(FDiskFile *this,bool quiet)

{
  DWORD *pDVar1;
  undefined8 *puVar2;
  FileReader *pFVar3;
  FUncompressedLump *pFVar4;
  int iVar5;
  char *pcVar6;
  DiskEntry *pDVar7;
  ulong *puVar8;
  size_t sVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  undefined7 in_register_00000031;
  uint *puVar15;
  DiskEntry *pDVar16;
  uint choicea;
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  DiskEntryList entries;
  DWORD result;
  TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry> local_98;
  undefined4 local_7c;
  uint local_78 [16];
  uint local_38;
  uint local_34;
  
  bVar19 = 0;
  local_7c = (undefined4)CONCAT71(in_register_00000031,quiet);
  pFVar3 = (this->super_FUncompressedFile).super_FResourceFile.Reader;
  pDVar7 = (DiskEntry *)0x0;
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar3,0,0);
  (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,local_78,4);
  local_98.Array = (DiskEntry *)0x0;
  local_98.Most = 0;
  local_98.Count = 0;
  if (local_78[0] != 0) {
    uVar12 = local_78[0] >> 0x18 | (local_78[0] & 0xff0000) >> 8 | (local_78[0] & 0xff00) << 8 |
             local_78[0] << 0x18;
    iVar13 = uVar12 + (uVar12 == 0);
    pDVar7 = (DiskEntry *)0x0;
    do {
      pFVar3 = (this->super_FUncompressedFile).super_FResourceFile.Reader;
      (*(pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar3,local_78,0x48);
      local_38 = (local_38 >> 0x18 | (local_38 & 0xff0000) >> 8 | (local_38 & 0xff00) << 8 |
                 local_38 << 0x18) + uVar12 * 0x48 + 8;
      local_34 = local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
                 local_34 << 0x18;
      pcVar6 = strrchr((char *)local_78,0x2e);
      if ((pcVar6 != (char *)0x0) && (iVar5 = strcasecmp(pcVar6,".wad"), iVar5 == 0)) {
        uVar18 = (ulong)local_98.Count;
        uVar17 = local_98.Count + 1;
        if (local_98.Most < uVar17) {
          uVar10 = (local_98.Most >> 1) + local_98.Most;
          if (local_98.Most < 0x10) {
            uVar10 = 0x10;
          }
          if (uVar10 < uVar17) {
            uVar10 = uVar17;
          }
          local_98.Most = uVar10;
          pDVar7 = (DiskEntry *)
                   M_Realloc_Dbg(pDVar7,(ulong)uVar10 * 0x48,
                                 "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                                 ,0x1ad);
        }
        puVar15 = local_78;
        pDVar16 = pDVar7 + uVar18;
        for (lVar11 = 0x12; lVar11 != 0; lVar11 = lVar11 + -1) {
          *(uint *)pDVar16->name = *puVar15;
          puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          pDVar16 = (DiskEntry *)((long)pDVar16 + (ulong)bVar19 * -8 + 4);
        }
        local_98.Count = uVar17;
      }
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  uVar18 = (ulong)local_98.Count;
  (this->super_FUncompressedFile).super_FResourceFile.NumLumps = local_98.Count;
  local_98.Array = pDVar7;
  if (uVar18 != 0) {
    puVar8 = (ulong *)operator_new__(uVar18 * 0x50 + 8);
    *puVar8 = uVar18;
    lVar11 = 0;
    do {
      *(undefined8 *)((long)puVar8 + lVar11 + 0x18) = 0x87e02c;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      *(undefined2 *)((long)puVar8 + lVar11 + 0x30) = 0;
      *(undefined1 *)((long)puVar8 + lVar11 + 0x20) = 0;
      puVar2 = (undefined8 *)((long)puVar8 + lVar11 + 0x38);
      *puVar2 = 0;
      puVar2[1] = 0;
      puVar2 = (undefined8 *)((long)puVar8 + lVar11 + 0x44);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined ***)
       ((long)&(((FUncompressedLump *)(puVar8 + 1))->super_FResourceLump)._vptr_FResourceLump +
       lVar11) = &PTR__FResourceLump_00864f00;
      lVar11 = lVar11 + 0x50;
    } while (uVar18 * 0x50 != lVar11);
    (this->super_FUncompressedFile).Lumps = (FUncompressedLump *)(puVar8 + 1);
    if ((this->super_FUncompressedFile).super_FResourceFile.NumLumps != 0) {
      lVar11 = 0x4c;
      uVar14 = 0;
      pDVar7 = local_98.Array;
      do {
        pFVar4 = (this->super_FUncompressedFile).Lumps;
        sVar9 = strlen(pDVar7->name);
        pcVar6 = (char *)operator_new__(sVar9 + 1);
        strcpy(pcVar6,pDVar7->name);
        pDVar1 = (DWORD *)((long)&(pFVar4->super_FResourceLump)._vptr_FResourceLump + lVar11);
        *(FDiskFile **)(pDVar1 + -5) = this;
        *pDVar1 = pDVar7->offset;
        pDVar1[-0x11] = pDVar7->size;
        *(undefined1 *)(pDVar1 + -9) = 4;
        FString::operator=((FString *)(pDVar1 + -0xf),pcVar6);
        uVar14 = uVar14 + 1;
        lVar11 = lVar11 + 0x50;
        pDVar7 = pDVar7 + 1;
      } while (uVar14 < (this->super_FUncompressedFile).super_FResourceFile.NumLumps);
    }
    if ((char)local_7c == '\0') {
      Printf(", %d lumps\n");
    }
  }
  TArray<(anonymous_namespace)::DiskEntry,_(anonymous_namespace)::DiskEntry>::~TArray(&local_98);
  return uVar18 != 0;
}

Assistant:

bool FDiskFile::Open(bool quiet)
{
	const DWORD entryCount = GetEntryCount(Reader);
	const DWORD dataOffest = GetDataOffset(entryCount);

	DiskEntryList entries;

	for (DWORD i = 0; i < entryCount; ++i)
	{
		DiskEntry entry;
		Reader->Read(&entry, sizeof entry);

		entry.offset = BigLong(entry.offset) + dataOffest;
		entry.size   = BigLong(entry.size);

		const char* const extension = strrchr(entry.name, '.');

		if (NULL != extension && 0 == stricmp(extension, ".wad"))
		{
			entries.Push(entry);
		}
	}

	NumLumps = entries.Size();

	if (0 == NumLumps)
	{
		return false;
	}

	Lumps = new FUncompressedLump[NumLumps];

	for (DWORD i = 0; i < NumLumps; ++i)
	{
		FUncompressedLump& lump = Lumps[i];
		const DiskEntry& entry = entries[i];

		char* const lumpName = new char[strlen(entry.name) + 1];
		strcpy(lumpName, entry.name);

		lump.Owner     = this;
		lump.Position  = entry.offset;
		lump.LumpSize  = entry.size;
		lump.Flags     = LUMPF_EMBEDDED;
		lump.FullName  = lumpName;
	}

	if (!quiet)
	{
		Printf(", %d lumps\n", NumLumps);
	}

	return true;
}